

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<Catch::SectionTracking::TestCaseTracker> * __thiscall
Catch::Option<Catch::SectionTracking::TestCaseTracker>::operator=
          (Option<Catch::SectionTracking::TestCaseTracker> *this,TestCaseTracker *_value)

{
  TestCaseTracker *_value_local;
  Option<Catch::SectionTracking::TestCaseTracker> *this_local;
  
  reset(this);
  SectionTracking::TestCaseTracker::TestCaseTracker((TestCaseTracker *)this->storage,_value);
  this->nullableValue = (TestCaseTracker *)this->storage;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }